

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnMemoryCopyExpr(Validator *this,MemoryCopyExpr *expr)

{
  Var local_b8;
  Var local_70;
  Enum local_24;
  MemoryCopyExpr *local_20;
  MemoryCopyExpr *expr_local;
  Validator *this_local;
  
  local_20 = expr;
  expr_local = (MemoryCopyExpr *)this;
  Var::Var(&local_70,&expr->srcmemidx);
  Var::Var(&local_b8,&local_20->destmemidx);
  local_24 = (Enum)SharedValidator::OnMemoryCopy
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)28>).super_Expr.loc,&local_70,
                              &local_b8);
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_b8);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnMemoryCopyExpr(MemoryCopyExpr* expr) {
  result_ |=
      validator_.OnMemoryCopy(expr->loc, expr->srcmemidx, expr->destmemidx);
  return Result::Ok;
}